

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::BaseDictionary(BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *this,BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *other)

{
  uint uVar1;
  code *pcVar2;
  Type TVar3;
  Type TVar4;
  Type TVar5;
  bool bVar6;
  DictionaryStats *pDVar7;
  undefined4 *puVar8;
  Type piVar9;
  Type pSVar10;
  size_t byteSize;
  
  this->alloc = other->alloc;
  if (other->count == other->freeCount) {
    this->size = 0;
    this->bucketCount = 0;
    this->count = 0;
    this->freeCount = 0;
    this->modFunctionIndex = 0x4b;
    this->buckets = (Type)0x0;
    this->entries = (Type)0x0;
    pDVar7 = (DictionaryStats *)0x0;
  }
  else {
    if (other->bucketCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xad,"(other.bucketCount != 0)","other.bucketCount != 0");
      if (!bVar6) goto LAB_004962be;
      *puVar8 = 0;
    }
    if (other->size == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xae,"(other.size != 0)","other.size != 0");
      if (!bVar6) goto LAB_004962be;
      *puVar8 = 0;
    }
    if ((ulong)other->bucketCount == 0) {
      this->buckets = (Type)0x8;
    }
    else {
      piVar9 = (Type)new__<Memory::JitArenaAllocator>
                               ((ulong)other->bucketCount << 2,this->alloc,0x3eba5c);
      this->buckets = piVar9;
      if (piVar9 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0xb1,"(buckets)","buckets");
        if (!bVar6) goto LAB_004962be;
        *puVar8 = 0;
      }
    }
    uVar1 = other->size;
    if ((ulong)uVar1 == 0) {
      this->entries = (Type)&DAT_00000008;
    }
    else {
      byteSize = 0xffffffffffffffff;
      if (-1 < (int)uVar1) {
        byteSize = (ulong)uVar1 << 5;
      }
      pSVar10 = (Type)new__<Memory::JitArenaAllocator>(byteSize,this->alloc,0x3eba5c);
      this->entries = pSVar10;
      if (pSVar10 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0xb6,"(entries)","entries");
        if (!bVar6) {
LAB_004962be:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
    uVar1 = other->bucketCount;
    TVar3 = other->bucketCount;
    TVar4 = other->count;
    TVar5 = other->freeList;
    this->size = other->size;
    this->bucketCount = TVar3;
    this->count = TVar4;
    this->freeList = TVar5;
    TVar4 = other->modFunctionIndex;
    this->freeCount = other->freeCount;
    this->modFunctionIndex = TVar4;
    Memory::CopyArray<int,int,Memory::Recycler>
              (this->buckets,(ulong)uVar1,other->buckets,(ulong)uVar1);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<StackSym*,StackLiteralInitFldData>,StackLiteralInitFldData,Memory::JitArenaAllocator>
              (this->entries,(long)this->size,other->entries,(long)this->size);
    pDVar7 = DictionaryStats::Create
                       ("PN6JsUtil14BaseDictionaryIP8StackSym23StackLiteralInitFldDataN6Memory17JitArenaAllocatorE20DictionarySizePolicyI14PowerOf2PolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_21SimpleDictionaryEntryENS_12NoResizeLockEEE"
                        ,this->size);
  }
  this->stats = pDVar7;
  return;
}

Assistant:

BaseDictionary(const BaseDictionary &other) :
          alloc(other.alloc)
        {
            if(other.Count() == 0)
            {
                size = 0;
                bucketCount = 0;
                buckets = nullptr;
                entries = nullptr;
                count = 0;
                freeCount = 0;
                modFunctionIndex = UNKNOWN_MOD_INDEX;

#if PROFILE_DICTIONARY
                stats = nullptr;
#endif
                return;
            }

            Assert(other.bucketCount != 0);
            Assert(other.size != 0);

            buckets = AllocateBuckets(other.bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            try
            {
                entries = AllocateEntries(other.size, false /* zeroAllocate */);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, other.bucketCount);
                throw;
            }

            size = other.size;
            bucketCount = other.bucketCount;
            count = other.count;
            freeList = other.freeList;
            freeCount = other.freeCount;
            modFunctionIndex = other.modFunctionIndex;

            CopyArray(buckets, bucketCount, other.buckets, bucketCount);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                entries, size, other.entries, size);

#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }